

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void aggr_update(void)

{
  CHAR_DATA *pCVar1;
  ulong uVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *pCVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  AFFECT_DATA *pAVar8;
  char *pcVar9;
  __type_conflict2 _Var10;
  int count;
  char buf [4608];
  int timer;
  AFFECT_DATA *paf;
  CHAR_DATA *victim;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *ch_next;
  CHAR_DATA *ch;
  CHAR_DATA *wch_next;
  CHAR_DATA *wch;
  CHAR_DATA *in_stack_ffffffffffffed18;
  CHAR_DATA *in_stack_ffffffffffffed20;
  CHAR_DATA *in_stack_ffffffffffffed28;
  CHAR_DATA *in_stack_ffffffffffffed30;
  CHAR_DATA *in_stack_ffffffffffffed38;
  CHAR_DATA *in_stack_ffffffffffffed40;
  CHAR_DATA *in_stack_ffffffffffffed48;
  AFFECT_DATA *in_stack_ffffffffffffed58;
  CHAR_DATA *in_stack_ffffffffffffed60;
  char local_1248 [396];
  int in_stack_ffffffffffffef44;
  CHAR_DATA *in_stack_ffffffffffffef48;
  CHAR_DATA *in_stack_ffffffffffffef50;
  int local_44;
  AFFECT_DATA *local_40;
  CHAR_DATA *local_38;
  CHAR_DATA *local_28;
  CHAR_DATA *local_18;
  CHAR_DATA *local_8;
  
  local_8 = char_list;
  pCVar1 = local_8;
  do {
    do {
      local_8 = pCVar1;
      if (local_8 == (CHAR_DATA *)0x0) {
        return;
      }
      pCVar1 = local_8->next;
    } while ((local_8->name == (char *)0x0) || (local_8->in_room == (ROOM_INDEX_DATA *)0x0));
    bVar5 = is_npc(in_stack_ffffffffffffed18);
    if ((bVar5) &&
       (uVar2 = local_8->progtypes[0], _Var10 = std::pow<int,int>(0,0x63b972),
       (uVar2 & (long)_Var10) != 0)) {
      (*(code *)local_8->pIndexData->mprogs->beat_prog)(local_8);
    }
    for (local_40 = local_8->affected; local_40 != (AFFECT_DATA *)0x0; local_40 = local_40->next) {
      if (local_40->beat_fun != (AFF_FUN *)0x0) {
        (*local_40->beat_fun)(local_8,local_40);
      }
    }
    bVar5 = is_npc(in_stack_ffffffffffffed18);
    if (((!bVar5) && (local_8->pulseTimer <= pc_race_table[local_8->race].racePulse)) ||
       ((bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5 && (local_8->pulseTimer < 0xd)))) {
      local_8->pulseTimer = local_8->pulseTimer + 1;
    }
    local_44 = (int)local_8->pulseTimer;
    bVar5 = is_affected_by(in_stack_ffffffffffffed28,(int)((ulong)in_stack_ffffffffffffed20 >> 0x20)
                          );
    if (bVar5) {
      local_44 = local_44 + 1;
    }
    bVar5 = is_affected_by(in_stack_ffffffffffffed28,(int)((ulong)in_stack_ffffffffffffed20 >> 0x20)
                          );
    if (bVar5) {
      local_44 = local_44 + -1;
    }
    if ((local_8->fighting != (CHAR_DATA *)0x0) &&
       (((bVar5 = is_npc(in_stack_ffffffffffffed18), !bVar5 &&
         (pc_race_table[local_8->race].racePulse <= local_44)) ||
        ((bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5 && (0xb < local_44)))))) {
      update_pc_last_fight(in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
      bVar5 = is_awake(local_8);
      if ((bVar5) && (local_8->in_room == local_8->fighting->in_room)) {
        multi_hit(in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef44);
      }
      else {
        stop_fighting(in_stack_ffffffffffffed20,SUB81((ulong)in_stack_ffffffffffffed18 >> 0x38,0));
      }
      local_8->pulseTimer = 0;
    }
    if ((local_8->position == 4) &&
       (uVar2 = local_8->imm_flags[0], _Var10 = std::pow<int,int>(0,0x63bc40),
       (uVar2 & (long)_Var10) != 0)) {
      local_8->position = 8;
    }
    bVar5 = is_affected_by(in_stack_ffffffffffffed28,(int)((ulong)in_stack_ffffffffffffed20 >> 0x20)
                          );
    if ((((bVar5) && (bVar5 = is_awake(local_8), bVar5)) && (local_8->fighting == (CHAR_DATA *)0x0))
       && ((local_8->desc != (DESCRIPTOR_DATA *)0x0 ||
           (bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5)))) {
      pCVar3 = local_8->in_room->people;
      do {
        do {
          local_28 = pCVar3;
          if (local_28 == (CHAR_DATA *)0x0) goto LAB_0063bf89;
          pCVar3 = local_28->next_in_room;
        } while (((local_8 == local_28) ||
                 (bVar5 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30), !bVar5)) ||
                (bVar5 = is_immortal(in_stack_ffffffffffffed18), bVar5));
        iVar6 = skill_lookup((char *)in_stack_ffffffffffffed28);
        bVar5 = is_affected(local_28,iVar6);
      } while (((((bVar5) ||
                 (bVar5 = check_stealth(in_stack_ffffffffffffed28,in_stack_ffffffffffffed20), bVar5)
                 ) || (bVar5 = is_safe_new(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                           SUB81((ulong)in_stack_ffffffffffffed38 >> 0x38,0)), bVar5
                      )) ||
               ((bVar5 = is_same_cabal(local_8,local_28), bVar5 &&
                (iVar6 = number_range((int)in_stack_ffffffffffffed20,
                                      (int)((ulong)in_stack_ffffffffffffed18 >> 0x20)), 1 < iVar6)))
               ) || (((bVar5 = is_same_group(local_8,local_28), bVar5 &&
                      (bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5)) ||
                     ((bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5 &&
                      (bVar5 = is_affected_by(in_stack_ffffffffffffed28,
                                              (int)((ulong)in_stack_ffffffffffffed20 >> 0x20)),
                      bVar5))))));
      bVar5 = is_same_cabal(local_8,local_28);
      if ((bVar5) && (local_8->in_room->cabal != 3)) {
        pcVar9 = get_char_color(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
        pcVar7 = END_COLOR(in_stack_ffffffffffffed28);
        sprintf(local_1248,
                "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r",
                pcVar9,pcVar7);
      }
      else {
        pcVar9 = get_char_color(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
        pcVar7 = END_COLOR(in_stack_ffffffffffffed28);
        sprintf(local_1248,"%sYou charge into frenzied battle!%s\n\r",pcVar9,pcVar7);
      }
      send_to_char((char *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
      do_murder((CHAR_DATA *)buf._4400_8_,(char *)buf._4392_8_);
    }
LAB_0063bf89:
    bVar5 = is_npc(in_stack_ffffffffffffed18);
    if ((((!bVar5) && (bVar5 = is_affected(local_8,(int)gsn_divine_frenzy), bVar5)) &&
        (bVar5 = is_awake(local_8), bVar5)) && (local_8->fighting == (CHAR_DATA *)0x0)) {
      pCVar3 = local_8->in_room->people;
      do {
        do {
          local_28 = pCVar3;
          if (local_28 == (CHAR_DATA *)0x0) goto LAB_0063c11f;
          pCVar3 = local_28->next_in_room;
          bVar5 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
        } while (((!bVar5) || (local_8 == local_28)) ||
                ((bVar5 = check_stealth(in_stack_ffffffffffffed28,in_stack_ffffffffffffed20), bVar5
                 || (bVar5 = is_safe_new(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                         SUB81((ulong)in_stack_ffffffffffffed38 >> 0x38,0)), bVar5))
                ));
        iVar6 = skill_lookup((char *)in_stack_ffffffffffffed28);
        bVar5 = is_affected(local_28,iVar6);
      } while ((bVar5) || (bVar5 = is_evil(in_stack_ffffffffffffed18), !bVar5));
      send_to_char((char *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
      do_murder((CHAR_DATA *)buf._4400_8_,(char *)buf._4392_8_);
    }
LAB_0063c11f:
    bVar5 = is_affected(local_8,(int)gsn_mark_of_wrath);
    if ((((bVar5) && (bVar5 = is_awake(local_8), bVar5)) && (local_8->fighting == (CHAR_DATA *)0x0))
       && ((local_8->desc != (DESCRIPTOR_DATA *)0x0 ||
           (bVar5 = is_npc(in_stack_ffffffffffffed18), bVar5)))) {
      pAVar8 = affect_find(local_8->affected,(int)gsn_mark_of_wrath);
      pCVar3 = local_8->in_room->people;
      do {
        do {
          local_28 = pCVar3;
          if (local_28 == (CHAR_DATA *)0x0) goto LAB_0063c370;
          pCVar3 = local_28->next_in_room;
          if (0 < pAVar8->owner->ghost) {
            affect_remove(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
          }
        } while ((local_8 == local_28) ||
                (bVar5 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30), !bVar5));
        iVar6 = skill_lookup((char *)in_stack_ffffffffffffed28);
        bVar5 = is_affected(local_28,iVar6);
      } while ((bVar5) ||
              ((bVar5 = is_safe_new(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                    SUB81((ulong)in_stack_ffffffffffffed38 >> 0x38,0)), bVar5 ||
               (local_28 != pAVar8->owner))));
      in_stack_ffffffffffffed58 =
           (AFFECT_DATA *)
           get_char_color(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
      in_stack_ffffffffffffed60 = (CHAR_DATA *)local_28->name;
      pcVar9 = END_COLOR(in_stack_ffffffffffffed28);
      sprintf(local_1248,
              "%sCatching sight of the mark upon %s\'s brow, you are consumed with wrath!%s\n\r",
              in_stack_ffffffffffffed58,in_stack_ffffffffffffed60,pcVar9);
      send_to_char((char *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
      do_murder((CHAR_DATA *)buf._4400_8_,(char *)buf._4392_8_);
    }
LAB_0063c370:
    bVar5 = is_npc(in_stack_ffffffffffffed18);
    if ((((!bVar5) && (local_8->level < 0x34)) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) &&
       ((local_8->in_room->area->empty & 1U) == 0)) {
      pCVar3 = local_8->in_room->people;
      while (local_18 = pCVar3, local_18 != (CHAR_DATA *)0x0) {
        pCVar3 = local_18->next_in_room;
        bVar5 = is_npc(in_stack_ffffffffffffed18);
        if (bVar5) {
          in_stack_ffffffffffffed48 = (CHAR_DATA *)local_18->act[0];
          _Var10 = std::pow<int,int>(0,0x63c43c);
          if (((ulong)in_stack_ffffffffffffed48 & (long)_Var10) != 0) {
            in_stack_ffffffffffffed40 = (CHAR_DATA *)local_18->in_room->room_flags[0];
            _Var10 = std::pow<int,int>(0,0x63c47d);
            if (((((ulong)in_stack_ffffffffffffed40 & (long)_Var10) == 0) &&
                ((bVar5 = is_npc(in_stack_ffffffffffffed18), !bVar5 ||
                 (bVar5 = is_affected_by(in_stack_ffffffffffffed28,
                                         (int)((ulong)in_stack_ffffffffffffed20 >> 0x20)), !bVar5)))
                ) && ((bVar5 = is_affected_by(in_stack_ffffffffffffed28,
                                              (int)((ulong)in_stack_ffffffffffffed20 >> 0x20)),
                      !bVar5 && (((local_18->fighting == (CHAR_DATA *)0x0 &&
                                  (bVar5 = is_affected_by(in_stack_ffffffffffffed28,
                                                          (int)((ulong)in_stack_ffffffffffffed20 >>
                                                               0x20)), !bVar5)) &&
                                 (bVar5 = is_awake(local_18), bVar5)))))) {
              in_stack_ffffffffffffed38 = (CHAR_DATA *)local_18->act[0];
              _Var10 = std::pow<int,int>(0,0x63c53e);
              if ((((((ulong)in_stack_ffffffffffffed38 & (long)_Var10) == 0) ||
                   (bVar5 = is_awake(local_8), !bVar5)) &&
                  (bVar5 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30), bVar5)) &&
                 (iVar6 = number_bits(0), iVar6 != 0)) {
                local_38 = (CHAR_DATA *)0x0;
                pCVar4 = local_8->in_room->people;
                while (local_28 = pCVar4, local_28 != (CHAR_DATA *)0x0) {
                  pCVar4 = local_28->next_in_room;
                  bVar5 = is_npc(in_stack_ffffffffffffed18);
                  if (((!bVar5) && (local_28->level < 0x34)) &&
                     ((bVar5 = is_heroimm(in_stack_ffffffffffffed18), !bVar5 &&
                      (local_28->level + -5 <= (int)local_18->level)))) {
                    in_stack_ffffffffffffed30 = (CHAR_DATA *)local_18->act[0];
                    _Var10 = std::pow<int,int>(0,0x63c674);
                    if (((((ulong)in_stack_ffffffffffffed30 & (long)_Var10) == 0) ||
                        (bVar5 = is_awake(local_28), !bVar5)) &&
                       (bVar5 = can_see(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30), bVar5)
                       ) {
                      in_stack_ffffffffffffed28 = (CHAR_DATA *)local_18->act[1];
                      _Var10 = std::pow<int,int>(0,0x63c6da);
                      if ((((ulong)in_stack_ffffffffffffed28 & (long)_Var10) == 0) || (2 < sun)) {
                        in_stack_ffffffffffffed20 = (CHAR_DATA *)local_18->act[0];
                        _Var10 = std::pow<int,int>(0,0x63c723);
                        if (((((ulong)in_stack_ffffffffffffed20 & (long)_Var10) == 0) ||
                            ((sun != 1 && (sun != 2)))) &&
                           (bVar5 = is_safe_new(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                                                SUB81((ulong)in_stack_ffffffffffffed38 >> 0x38,0)),
                           !bVar5)) {
                          in_stack_ffffffffffffed18 = local_28;
                          iVar6 = skill_lookup((char *)in_stack_ffffffffffffed28);
                          bVar5 = is_affected(in_stack_ffffffffffffed18,iVar6);
                          if ((!bVar5) &&
                             (iVar6 = number_range((int)in_stack_ffffffffffffed20,
                                                   (int)((ulong)in_stack_ffffffffffffed18 >> 0x20)),
                             iVar6 == 0)) {
                            local_38 = local_28;
                          }
                        }
                      }
                    }
                  }
                }
                if (local_38 != (CHAR_DATA *)0x0) {
                  multi_hit(in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,
                            in_stack_ffffffffffffef44);
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void aggr_update(void)
{
	CHAR_DATA *wch;
	CHAR_DATA *wch_next;
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	CHAR_DATA *victim;
	AFFECT_DATA *paf;
	int timer;
	char buf[MAX_STRING_LENGTH];

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (!wch->name)
			continue;

		if (!wch->in_room)
			continue;

		if (is_npc(wch) && IS_SET(wch->progtypes, MPROG_BEAT))
			(wch->pIndexData->mprogs->beat_prog)(wch);

		for (paf = wch->affected; paf; paf = paf->next)
		{
			if (paf->beat_fun)
				(*paf->beat_fun)(wch, paf);
		}

		if ((!is_npc(wch) && wch->pulseTimer <= pc_race_table[wch->race].racePulse)
			|| (is_npc(wch) && wch->pulseTimer <= 12))
			wch->pulseTimer++;

		timer = wch->pulseTimer;

		if (is_affected_by(wch, AFF_HASTE))
			timer++;

		if (is_affected_by(wch, AFF_SLOW))
			timer--;

		if (wch->fighting &&
			((!is_npc(wch) && timer >= pc_race_table[wch->race].racePulse) || (is_npc(wch) && timer >= 12)))
		{
			update_pc_last_fight(wch, wch->fighting);

			if (is_awake(wch) && wch->in_room == wch->fighting->in_room)
				multi_hit(wch, wch->fighting, TYPE_UNDEFINED);
			else
				stop_fighting(wch, false);

			wch->pulseTimer = 0;
		}

		if (wch->position == POS_SLEEPING && IS_SET(wch->imm_flags, IMM_SLEEP))
			wch->position = POS_STANDING;

		if (is_affected_by(wch, AFF_RAGE) && is_awake(wch) && !wch->fighting && !(wch->desc == nullptr && !is_npc(wch)))
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (wch != vch && can_see(wch, vch) && !is_immortal(vch))
				{
					if (is_affected(vch, skill_lookup("radiance")))
						continue;

					if (check_stealth(vch, wch))
						continue;

					if (is_safe_new(wch, vch, false))
						continue;

					if (is_same_cabal(wch, vch) && number_range(1, 10000) > 1)
						continue;

					if (is_same_group(wch, vch) && is_npc(vch))
						continue;

					if (is_npc(wch) && is_affected_by(wch, AFF_NOSHOW))
						continue;

					if (is_same_cabal(wch, vch) && wch->in_room->cabal != CABAL_HORDE)
					{
						sprintf(buf, "%sYour thirst for blood overcomes you and you leap at the nearest target!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}
					else
					{
						sprintf(buf, "%sYou charge into frenzied battle!%s\n\r",
							get_char_color(wch, "lightred"),
							END_COLOR(wch));
					}

					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (!is_npc(wch) && is_affected(wch, gsn_divine_frenzy) && is_awake(wch) && !wch->fighting)
		{
			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!can_see(wch, vch) || wch == vch)
					continue;

				if (check_stealth(vch, wch))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (!is_evil(vch))
					continue;

				send_to_char("Righteous anger swells within you as you lash out at the wicked!\n\r", wch);
				do_murder(wch, vch->name);
				break;
			}
		}

		if (is_affected(wch, gsn_mark_of_wrath)
			&& is_awake(wch)
			&& !wch->fighting
			&& !(wch->desc == nullptr && !is_npc(wch)))
		{
			paf = affect_find(wch->affected, gsn_mark_of_wrath);

			for (vch = wch->in_room->people; vch; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (paf->owner->ghost > 0)
					affect_remove(wch, paf);

				if (wch == vch || !can_see(wch, vch))
					continue;

				if (is_affected(vch, skill_lookup("radiance")))
					continue;

				if (is_safe_new(wch, vch, false))
					continue;

				if (vch == paf->owner)
				{
					sprintf(buf, "%sCatching sight of the mark upon %s's brow, you are consumed with wrath!%s\n\r",
						get_char_color(wch, "lightred"),
						vch->name,
						END_COLOR(wch));
					send_to_char(buf, wch);
					do_murder(wch, vch->name);
					break;
				}
			}
		}

		if (is_npc(wch) || wch->level >= LEVEL_IMMORTAL || wch->in_room == nullptr || wch->in_room->area->empty)
			continue;

		for (ch = wch->in_room->people; ch != nullptr; ch = ch_next)
		{
			int count;

			ch_next = ch->next_in_room;

			if (!is_npc(ch)
				|| !IS_SET(ch->act, ACT_AGGRESSIVE)
				|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
				|| (is_npc(ch) && is_affected_by(ch, AFF_NOSHOW))
				|| is_affected_by(ch, AFF_CALM)
				|| ch->fighting != nullptr
				|| is_affected_by(ch, AFF_CHARM)
				|| !is_awake(ch)
				|| (IS_SET(ch->act, ACT_WIMPY) && is_awake(wch))
				|| !can_see(ch, wch)
				|| number_bits(1) == 0)
			{
				continue;
			}

			/*
			 * Ok we have a 'wch' player character and a 'ch' npc aggressor.
			 * Now make the aggressor fight a RANDOM pc victim in the room,
			 *   giving each 'vch' an equal chance of selection.
			 */
			count = 0;
			victim = nullptr;

			for (vch = wch->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (!is_npc(vch)
					&& vch->level < LEVEL_IMMORTAL
					&& !is_heroimm(vch)
					&& ch->level >= vch->level - 5
					&& (!IS_SET(ch->act, ACT_WIMPY) || !is_awake(vch))
					&& can_see(ch, vch)
					&& (!IS_SET(ch->act, ACT_DIURNAL) || sun >= SolarPosition::Sunset)
					&& (!IS_SET(ch->act, ACT_NOCTURNAL) || (sun != SolarPosition::Sunrise && sun != SolarPosition::Daylight))
					&& !is_safe_new(ch, vch, false)
					&& !is_affected(vch, skill_lookup("radiance")))
				{
					if (number_range(0, count) == 0)
						victim = vch;

					count++;
				}
			}

			if (victim == nullptr)
				continue;

			multi_hit(ch, victim, TYPE_UNDEFINED);
		}
	}
}